

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall ASN1Test_SetBit_Test::TestBody(ASN1Test_SetBit_Test *this)

{
  bool bVar1;
  ASN1_BIT_STRING *pAVar2;
  char *pcVar3;
  pointer paVar4;
  char *in_R9;
  Span<const_unsigned_char> local_a28;
  string local_a18;
  AssertHelper local_9f8;
  Message local_9f0;
  int local_9e4;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_9b0;
  Message local_9a8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar__13;
  Message local_988;
  int local_980 [2];
  undefined1 local_978 [8];
  AssertionResult gtest_ar_32;
  Message local_960;
  int local_958 [2];
  undefined1 local_950 [8];
  AssertionResult gtest_ar_31;
  Message local_938;
  int local_930 [2];
  undefined1 local_928 [8];
  AssertionResult gtest_ar_30;
  Message local_910;
  int local_908 [2];
  undefined1 local_900 [8];
  AssertionResult gtest_ar_29;
  string local_8e0;
  AssertHelper local_8c0;
  Message local_8b8;
  int local_8ac;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar__12;
  string local_888;
  AssertHelper local_868;
  Message local_860;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__11;
  Message local_840;
  int local_838 [2];
  undefined1 local_830 [8];
  AssertionResult gtest_ar_28;
  Message local_818;
  int local_810 [2];
  undefined1 local_808 [8];
  AssertionResult gtest_ar_27;
  Message local_7f0;
  int local_7e8 [2];
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_26;
  Message local_7c8;
  int local_7c0 [2];
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_25;
  string local_798;
  AssertHelper local_778;
  Message local_770;
  int local_764;
  undefined1 local_760 [8];
  AssertionResult gtest_ar__10;
  string local_740;
  AssertHelper local_720;
  Message local_718;
  undefined1 local_710 [8];
  AssertionResult gtest_ar__9;
  uint8_t *ptr;
  Message local_6f0;
  int local_6e8 [2];
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_24;
  Message local_6c8;
  int local_6c0 [2];
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_23;
  Message local_6a0;
  int local_698 [2];
  undefined1 local_690 [8];
  AssertionResult gtest_ar_22;
  Message local_678;
  int local_670 [2];
  undefined1 local_668 [8];
  AssertionResult gtest_ar_21;
  string local_648;
  AssertHelper local_628;
  Message local_620;
  int local_614;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__8;
  Message local_5f8;
  int local_5f0 [2];
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_20;
  Message local_5d0;
  int local_5c8 [2];
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_19;
  Message local_5a8;
  int local_5a0 [2];
  undefined1 local_598 [8];
  AssertionResult gtest_ar_18;
  Message local_580;
  int local_578 [2];
  undefined1 local_570 [8];
  AssertionResult gtest_ar_17;
  string local_550;
  AssertHelper local_530;
  Message local_528;
  int local_51c;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__7;
  Message local_500;
  int local_4f8 [2];
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_16;
  Message local_4d8;
  int local_4d0 [2];
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_15;
  Message local_4b0;
  int local_4a8 [2];
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_14;
  Message local_488;
  int local_480 [2];
  undefined1 local_478 [8];
  AssertionResult gtest_ar_13;
  Message local_460;
  int local_458 [2];
  undefined1 local_450 [8];
  AssertionResult gtest_ar_12;
  string local_430;
  AssertHelper local_410;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__6;
  Message local_3e0;
  int local_3d8 [2];
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_11;
  Message local_3b8;
  int local_3b0 [2];
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_10;
  Message local_390;
  int local_388 [2];
  undefined1 local_380 [8];
  AssertionResult gtest_ar_9;
  Message local_368;
  int local_360 [2];
  undefined1 local_358 [8];
  AssertionResult gtest_ar_8;
  Message local_340;
  int local_338 [2];
  undefined1 local_330 [8];
  AssertionResult gtest_ar_7;
  string local_310;
  AssertHelper local_2f0;
  Message local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__5;
  Message local_2c0;
  int local_2b8 [2];
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_6;
  Message local_298;
  int local_290 [2];
  undefined1 local_288 [8];
  AssertionResult gtest_ar_5;
  Message local_270;
  int local_268 [2];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_4;
  Message local_248;
  int local_240 [2];
  undefined1 local_238 [8];
  AssertionResult gtest_ar_3;
  Message local_220;
  int local_218 [2];
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  Message local_c8;
  int local_c0 [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  int local_98 [2];
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<ASN1_BIT_STRING> val;
  ASN1Test_SetBit_Test *this_local;
  
  pAVar2 = ASN1_BIT_STRING_new();
  std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar_.message_,
             (pointer)pAVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x826df3,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x310,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    bssl::Span<unsigned_char_const>::Span<3ul>
              ((Span<unsigned_char_const> *)&gtest_ar.message_,(uchar (*) [3])"\x03\x01");
    TestSerialize<asn1_string_st*,asn1_string_st_const*>
              (paVar4,i2d_ASN1_BIT_STRING,stack0xffffffffffffff80);
    local_98[1] = 0;
    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_98[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_90,"0","ASN1_BIT_STRING_get_bit(val.get(), 0)",local_98 + 1,
               local_98);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x313,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    local_c0[1] = 0;
    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_c0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,100);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_b8,"0","ASN1_BIT_STRING_get_bit(val.get(), 100)",local_c0 + 1,
               local_c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x314,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_e4 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,0,1);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_e0,&local_e4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_e0,
                 (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 0, 1)","false","true",in_R9)
      ;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x317,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    if (bVar1) {
      paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                         );
      local_12c = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,1,1);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_128,&local_12c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,
                   (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 1, 1)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x318,pcVar3);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_138);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (bVar1) {
        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        local_174 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,2,0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_170,&local_174,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_170,
                     (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 2, 0)","false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x319,pcVar3);
          testing::internal::AssertHelper::operator=(&local_188,&local_180);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_180);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        if (bVar1) {
          paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          local_1bc = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,3,1);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1b8,&local_1bc,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
          if (!bVar1) {
            testing::Message::Message(&local_1c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_1f0,(internal *)local_1b8,
                       (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 3, 1)","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x31a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper(&local_1d0);
            std::__cxx11::string::~string((string *)&local_1f0);
            testing::Message::~Message(&local_1c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
          if (bVar1) {
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            bssl::Span<unsigned_char_const>::Span<4ul>
                      ((Span<unsigned_char_const> *)&gtest_ar_2.message_,&TestBody::kBitString1101);
            TestSerialize<asn1_string_st*,asn1_string_st_const*>
                      (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffffe00);
            local_218[1] = 1;
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_218[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_210,"1","ASN1_BIT_STRING_get_bit(val.get(), 0)",
                       local_218 + 1,local_218);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
            if (!bVar1) {
              testing::Message::Message(&local_220);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x31d,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_3.message_,&local_220);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_220);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
            local_240[1] = 1;
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_240[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_238,"1","ASN1_BIT_STRING_get_bit(val.get(), 1)",
                       local_240 + 1,local_240);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
            if (!bVar1) {
              testing::Message::Message(&local_248);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x31e,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_248);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_248);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
            local_268[1] = 0;
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_268[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,2);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_260,"0","ASN1_BIT_STRING_get_bit(val.get(), 2)",
                       local_268 + 1,local_268);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
            if (!bVar1) {
              testing::Message::Message(&local_270);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,799,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_270);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_270);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
            local_290[1] = 1;
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_290[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,3);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_288,"1","ASN1_BIT_STRING_get_bit(val.get(), 3)",
                       local_290 + 1,local_290);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
            if (!bVar1) {
              testing::Message::Message(&local_298);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,800,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_298);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_298);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
            local_2b8[1] = 0;
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_2b8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,4);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_2b0,"0","ASN1_BIT_STRING_get_bit(val.get(), 4)",
                       local_2b8 + 1,local_2b8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
            if (!bVar1) {
              testing::Message::Message(&local_2c0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x321,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_2c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_2c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_2dc = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,1,0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2d8,&local_2dc,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
            if (!bVar1) {
              testing::Message::Message(&local_2e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_310,(internal *)local_2d8,
                         (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 1, 0)","false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x324,pcVar3);
              testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
              testing::internal::AssertHelper::~AssertHelper(&local_2f0);
              std::__cxx11::string::~string((string *)&local_310);
              testing::Message::~Message(&local_2e8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
            if (bVar1) {
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              bssl::Span<unsigned_char_const>::Span<4ul>
                        ((Span<unsigned_char_const> *)&gtest_ar_7.message_,&TestBody::kBitString1001
                        );
              TestSerialize<asn1_string_st*,asn1_string_st_const*>
                        (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffffce0);
              local_338[1] = 1;
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_338[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_330,"1","ASN1_BIT_STRING_get_bit(val.get(), 0)",
                         local_338 + 1,local_338);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
              if (!bVar1) {
                testing::Message::Message(&local_340);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x327,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_8.message_,&local_340);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_)
                ;
                testing::Message::~Message(&local_340);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
              local_360[1] = 0;
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_360[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,1);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_358,"0","ASN1_BIT_STRING_get_bit(val.get(), 1)",
                         local_360 + 1,local_360);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
              if (!bVar1) {
                testing::Message::Message(&local_368);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x328,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_9.message_,&local_368);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_)
                ;
                testing::Message::~Message(&local_368);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
              local_388[1] = 0;
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_388[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,2);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_380,"0","ASN1_BIT_STRING_get_bit(val.get(), 2)",
                         local_388 + 1,local_388);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
              if (!bVar1) {
                testing::Message::Message(&local_390);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x329,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_10.message_,&local_390);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_10.message_);
                testing::Message::~Message(&local_390);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
              local_3b0[1] = 1;
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_3b0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,3);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_3a8,"1","ASN1_BIT_STRING_get_bit(val.get(), 3)",
                         local_3b0 + 1,local_3b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
              if (!bVar1) {
                testing::Message::Message(&local_3b8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x32a,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_11.message_,&local_3b8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_11.message_);
                testing::Message::~Message(&local_3b8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
              local_3d8[1] = 0;
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_3d8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,4);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_3d0,"0","ASN1_BIT_STRING_get_bit(val.get(), 4)",
                         local_3d8 + 1,local_3d8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
              if (!bVar1) {
                testing::Message::Message(&local_3e0);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x32b,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__6.message_,&local_3e0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_3e0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_3fc = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,3,0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_3f8,&local_3fc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
              if (!bVar1) {
                testing::Message::Message(&local_408);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_430,(internal *)local_3f8,
                           (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 3, 0)","false",
                           "true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_410,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x32e,pcVar3);
                testing::internal::AssertHelper::operator=(&local_410,&local_408);
                testing::internal::AssertHelper::~AssertHelper(&local_410);
                std::__cxx11::string::~string((string *)&local_430);
                testing::Message::~Message(&local_408);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
              if (bVar1) {
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                bssl::Span<unsigned_char_const>::Span<4ul>
                          ((Span<unsigned_char_const> *)&gtest_ar_12.message_,&TestBody::kBitString1
                          );
                TestSerialize<asn1_string_st*,asn1_string_st_const*>
                          (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffffbc0);
                local_458[1] = 1;
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_458[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_450,"1","ASN1_BIT_STRING_get_bit(val.get(), 0)",
                           local_458 + 1,local_458);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_450);
                if (!bVar1) {
                  testing::Message::Message(&local_460);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0x331,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_13.message_,&local_460);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_13.message_);
                  testing::Message::~Message(&local_460);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
                local_480[1] = 0;
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_480[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,1);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_478,"0","ASN1_BIT_STRING_get_bit(val.get(), 1)",
                           local_480 + 1,local_480);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_478);
                if (!bVar1) {
                  testing::Message::Message(&local_488);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0x332,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_14.message_,&local_488);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_14.message_);
                  testing::Message::~Message(&local_488);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
                local_4a8[1] = 0;
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_4a8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,2);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_4a0,"0","ASN1_BIT_STRING_get_bit(val.get(), 2)",
                           local_4a8 + 1,local_4a8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4a0);
                if (!bVar1) {
                  testing::Message::Message(&local_4b0);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0x333,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_15.message_,&local_4b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_15.message_);
                  testing::Message::~Message(&local_4b0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
                local_4d0[1] = 0;
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_4d0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,3);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_4c8,"0","ASN1_BIT_STRING_get_bit(val.get(), 3)",
                           local_4d0 + 1,local_4d0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4c8);
                if (!bVar1) {
                  testing::Message::Message(&local_4d8);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0x334,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_16.message_,&local_4d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_16.message_);
                  testing::Message::~Message(&local_4d8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
                local_4f8[1] = 0;
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_4f8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,4);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_4f0,"0","ASN1_BIT_STRING_get_bit(val.get(), 4)",
                           local_4f8 + 1,local_4f8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4f0);
                if (!bVar1) {
                  testing::Message::Message(&local_500);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0x335,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__7.message_,&local_500);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_500);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_51c = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,0x3f,1);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_518,&local_51c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_518);
                if (!bVar1) {
                  testing::Message::Message(&local_528);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_550,(internal *)local_518,
                             (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 63, 1)","false",
                             "true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_530,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0x338,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_530,&local_528);
                  testing::internal::AssertHelper::~AssertHelper(&local_530);
                  std::__cxx11::string::~string((string *)&local_550);
                  testing::Message::~Message(&local_528);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
                if (bVar1) {
                  paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  bssl::Span<unsigned_char_const>::Span<11ul>
                            ((Span<unsigned_char_const> *)&gtest_ar_17.message_,
                             (uchar (*) [11])"\x03\t");
                  TestSerialize<asn1_string_st*,asn1_string_st_const*>
                            (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffffaa0);
                  local_578[1] = 1;
                  paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_578[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_570,"1","ASN1_BIT_STRING_get_bit(val.get(), 0)",
                             local_578 + 1,local_578);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_570);
                  if (!bVar1) {
                    testing::Message::Message(&local_580);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_570)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0x33c,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_18.message_,&local_580);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_18.message_);
                    testing::Message::~Message(&local_580);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
                  local_5a0[1] = 0;
                  paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_5a0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3e);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_598,"0","ASN1_BIT_STRING_get_bit(val.get(), 62)",
                             local_5a0 + 1,local_5a0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_598);
                  if (!bVar1) {
                    testing::Message::Message(&local_5a8);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_598)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0x33d,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_19.message_,&local_5a8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_19.message_);
                    testing::Message::~Message(&local_5a8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
                  local_5c8[1] = 1;
                  paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_5c8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3f);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_5c0,"1","ASN1_BIT_STRING_get_bit(val.get(), 63)",
                             local_5c8 + 1,local_5c8);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_5c0);
                  if (!bVar1) {
                    testing::Message::Message(&local_5d0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0x33e,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_20.message_,&local_5d0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_20.message_);
                    testing::Message::~Message(&local_5d0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
                  local_5f0[1] = 0;
                  paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_5f0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x40);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_5e8,"0","ASN1_BIT_STRING_get_bit(val.get(), 64)",
                             local_5f0 + 1,local_5f0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_5e8);
                  if (!bVar1) {
                    testing::Message::Message(&local_5f8);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0x33f,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__8.message_,&local_5f8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_5f8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
                  paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_614 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,0x3f,0);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_610,&local_614,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_610);
                  if (!bVar1) {
                    testing::Message::Message(&local_620);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_648,(internal *)local_610,
                               (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 63, 0)",
                               "false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_628,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0x342,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_628,&local_620);
                    testing::internal::AssertHelper::~AssertHelper(&local_628);
                    std::__cxx11::string::~string((string *)&local_648);
                    testing::Message::~Message(&local_620);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
                  if (bVar1) {
                    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    bssl::Span<unsigned_char_const>::Span<4ul>
                              ((Span<unsigned_char_const> *)&gtest_ar_21.message_,
                               &TestBody::kBitString1);
                    TestSerialize<asn1_string_st*,asn1_string_st_const*>
                              (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffff9a8);
                    local_670[1] = 1;
                    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    local_670[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_668,"1","ASN1_BIT_STRING_get_bit(val.get(), 0)",
                               local_670 + 1,local_670);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_668);
                    if (!bVar1) {
                      testing::Message::Message(&local_678);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_668);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0x344,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_22.message_,&local_678);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_22.message_);
                      testing::Message::~Message(&local_678);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
                    local_698[1] = 0;
                    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    local_698[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3e);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_690,"0","ASN1_BIT_STRING_get_bit(val.get(), 62)",
                               local_698 + 1,local_698);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_690);
                    if (!bVar1) {
                      testing::Message::Message(&local_6a0);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_690);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0x345,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_23.message_,&local_6a0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_23.message_);
                      testing::Message::~Message(&local_6a0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
                    local_6c0[1] = 0;
                    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    local_6c0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3f);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_6b8,"0","ASN1_BIT_STRING_get_bit(val.get(), 63)",
                               local_6c0 + 1,local_6c0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_6b8);
                    if (!bVar1) {
                      testing::Message::Message(&local_6c8);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_6b8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0x346,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_24.message_,&local_6c8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_24.message_);
                      testing::Message::~Message(&local_6c8);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
                    local_6e8[1] = 0;
                    paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    local_6e8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x40);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_6e0,"0","ASN1_BIT_STRING_get_bit(val.get(), 64)",
                               local_6e8 + 1,local_6e8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_6e0);
                    if (!bVar1) {
                      testing::Message::Message(&local_6f0);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_6e0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&ptr,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0x347,pcVar3);
                      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,&local_6f0);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                      testing::Message::~Message(&local_6f0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
                    gtest_ar__9.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )TestBody::kBitStringLong;
                    pAVar2 = d2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)0x0,
                                                 (uchar **)&gtest_ar__9.message_,0xb);
                    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::reset
                              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                               &gtest_ar_.message_,(pointer)pAVar2);
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_710,
                               (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                               &gtest_ar_.message_,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_710);
                    if (!bVar1) {
                      testing::Message::Message(&local_718);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_740,(internal *)local_710,(AssertionResult *)0x826df3,
                                 "false","true",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_720,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0x34d,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_720,&local_718);
                      testing::internal::AssertHelper::~AssertHelper(&local_720);
                      std::__cxx11::string::~string((string *)&local_740);
                      testing::Message::~Message(&local_718);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
                    if (bVar1) {
                      paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      bssl::Span<unsigned_char_const>::Span<11ul>
                                ((Span<unsigned_char_const> *)&gtest_ar__10.message_,
                                 (uchar (*) [11])"\x03\t");
                      TestSerialize<asn1_string_st*,asn1_string_st_const*>
                                (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffff8b0);
                      paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      local_764 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,0x3f,0);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_760,&local_764,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_760);
                      if (!bVar1) {
                        testing::Message::Message(&local_770);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_798,(internal *)local_760,
                                   (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 63, 0)",
                                   "false","true",in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_778,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                   ,0x34f,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_778,&local_770);
                        testing::internal::AssertHelper::~AssertHelper(&local_778);
                        std::__cxx11::string::~string((string *)&local_798);
                        testing::Message::~Message(&local_770);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
                      if (bVar1) {
                        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        bssl::Span<unsigned_char_const>::Span<4ul>
                                  ((Span<unsigned_char_const> *)&gtest_ar_25.message_,
                                   &TestBody::kBitString1);
                        TestSerialize<asn1_string_st*,asn1_string_st_const*>
                                  (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffff858);
                        local_7c0[1] = 1;
                        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_7c0[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_7b8,"1","ASN1_BIT_STRING_get_bit(val.get(), 0)"
                                   ,local_7c0 + 1,local_7c0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_7b8);
                        if (!bVar1) {
                          testing::Message::Message(&local_7c8);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_7b8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0x351,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_26.message_,&local_7c8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_26.message_);
                          testing::Message::~Message(&local_7c8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
                        local_7e8[1] = 0;
                        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_7e8[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3e);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_7e0,"0",
                                   "ASN1_BIT_STRING_get_bit(val.get(), 62)",local_7e8 + 1,local_7e8)
                        ;
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_7e0);
                        if (!bVar1) {
                          testing::Message::Message(&local_7f0);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_7e0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0x352,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_27.message_,&local_7f0);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_27.message_);
                          testing::Message::~Message(&local_7f0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
                        local_810[1] = 0;
                        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_810[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3f);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_808,"0",
                                   "ASN1_BIT_STRING_get_bit(val.get(), 63)",local_810 + 1,local_810)
                        ;
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_808);
                        if (!bVar1) {
                          testing::Message::Message(&local_818);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_808);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0x353,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_28.message_,&local_818);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_28.message_);
                          testing::Message::~Message(&local_818);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
                        local_838[1] = 0;
                        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_838[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x40);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_830,"0",
                                   "ASN1_BIT_STRING_get_bit(val.get(), 64)",local_838 + 1,local_838)
                        ;
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_830);
                        if (!bVar1) {
                          testing::Message::Message(&local_840);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_830);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0x354,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__11.message_,&local_840);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__11.message_);
                          testing::Message::~Message(&local_840);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
                        gtest_ar__9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )TestBody::kBitString10010;
                        pAVar2 = d2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)0x0,
                                                     (uchar **)&gtest_ar__9.message_,4);
                        std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::reset
                                  ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                   &gtest_ar_.message_,(pointer)pAVar2);
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_858,
                                   (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                   &gtest_ar_.message_,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_858);
                        if (!bVar1) {
                          testing::Message::Message(&local_860);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_888,(internal *)local_858,(AssertionResult *)0x826df3,
                                     "false","true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_868,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0x35a,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_868,&local_860);
                          testing::internal::AssertHelper::~AssertHelper(&local_868);
                          std::__cxx11::string::~string((string *)&local_888);
                          testing::Message::~Message(&local_860);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
                        if (bVar1) {
                          paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *
                                              )&gtest_ar_.message_);
                          bssl::Span<unsigned_char_const>::Span<4ul>
                                    ((Span<unsigned_char_const> *)&gtest_ar__12.message_,
                                     &TestBody::kBitString10010);
                          TestSerialize<asn1_string_st*,asn1_string_st_const*>
                                    (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffff768);
                          paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *
                                              )&gtest_ar_.message_);
                          local_8ac = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar4,0,1);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_8a8,&local_8ac,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_8a8);
                          if (!bVar1) {
                            testing::Message::Message(&local_8b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      (&local_8e0,(internal *)local_8a8,
                                       (AssertionResult *)"ASN1_BIT_STRING_set_bit(val.get(), 0, 1)"
                                       ,"false","true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_8c0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                       ,0x35d,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_8c0,&local_8b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_8c0);
                            std::__cxx11::string::~string((string *)&local_8e0);
                            testing::Message::~Message(&local_8b8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
                          if (bVar1) {
                            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar_.message_);
                            bssl::Span<unsigned_char_const>::Span<4ul>
                                      ((Span<unsigned_char_const> *)&gtest_ar_29.message_,
                                       &TestBody::kBitString1001);
                            TestSerialize<asn1_string_st*,asn1_string_st_const*>
                                      (paVar4,i2d_ASN1_BIT_STRING,stack0xfffffffffffff710);
                            local_908[1] = 1;
                            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar_.message_);
                            local_908[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_900,"1",
                                       "ASN1_BIT_STRING_get_bit(val.get(), 0)",local_908 + 1,
                                       local_908);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_900);
                            if (!bVar1) {
                              testing::Message::Message(&local_910);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_900);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                         ,0x35f,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_30.message_,&local_910);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_30.message_);
                              testing::Message::~Message(&local_910);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_900)
                            ;
                            local_930[1] = 0;
                            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar_.message_);
                            local_930[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3e);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_928,"0",
                                       "ASN1_BIT_STRING_get_bit(val.get(), 62)",local_930 + 1,
                                       local_930);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_928);
                            if (!bVar1) {
                              testing::Message::Message(&local_938);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_928);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                         ,0x360,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_31.message_,&local_938);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_31.message_);
                              testing::Message::~Message(&local_938);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_928)
                            ;
                            local_958[1] = 0;
                            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar_.message_);
                            local_958[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x3f);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_950,"0",
                                       "ASN1_BIT_STRING_get_bit(val.get(), 63)",local_958 + 1,
                                       local_958);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_950);
                            if (!bVar1) {
                              testing::Message::Message(&local_960);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_950);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                         ,0x361,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_32.message_,&local_960);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_32.message_);
                              testing::Message::~Message(&local_960);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_950)
                            ;
                            local_980[1] = 0;
                            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar_.message_);
                            local_980[0] = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)paVar4,0x40);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_978,"0",
                                       "ASN1_BIT_STRING_get_bit(val.get(), 64)",local_980 + 1,
                                       local_980);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_978);
                            if (!bVar1) {
                              testing::Message::Message(&local_988);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_978);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                         ,0x362,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar__13.message_,&local_988);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar__13.message_);
                              testing::Message::~Message(&local_988);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_978)
                            ;
                            pAVar2 = ASN1_BIT_STRING_new();
                            std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::reset
                                      ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                       &gtest_ar_.message_,(pointer)pAVar2);
                            testing::AssertionResult::
                            AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                                      ((AssertionResult *)local_9a0,
                                       (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                       &gtest_ar_.message_,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_9a0);
                            if (!bVar1) {
                              testing::Message::Message(&local_9a8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__14.message_,(internal *)local_9a0,
                                         (AssertionResult *)0x826df3,"false","true",in_R9);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_9b0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                         ,0x366,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
                              testing::internal::AssertHelper::~AssertHelper(&local_9b0);
                              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                              testing::Message::~Message(&local_9a8);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0)
                            ;
                            if (bVar1) {
                              paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                                 ((
                                                  unique_ptr<asn1_string_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar_.message_);
                              local_9e4 = ASN1_STRING_set(paVar4,"",0x40);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_9e0,&local_9e4,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_9e0);
                              if (!bVar1) {
                                testing::Message::Message(&local_9f0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_a18,(internal *)local_9e0,
                                           (AssertionResult *)
                                           "ASN1_STRING_set(val.get(), kZeros, sizeof(kZeros))",
                                           "false","true",in_R9);
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_9f8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                           ,0x368,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
                                testing::internal::AssertHelper::~AssertHelper(&local_9f8);
                                std::__cxx11::string::~string((string *)&local_a18);
                                testing::Message::~Message(&local_9f0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_9e0);
                              if (bVar1) {
                                paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::
                                         get((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                             &gtest_ar_.message_);
                                bssl::Span<unsigned_char_const>::Span<3ul>
                                          ((Span<unsigned_char_const> *)&local_a28,
                                           (uchar (*) [3])"\x03\x01");
                                TestSerialize<asn1_string_st*,asn1_string_st_const*>
                                          (paVar4,i2d_ASN1_BIT_STRING,local_a28);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ASN1Test, SetBit) {
  bssl::UniquePtr<ASN1_BIT_STRING> val(ASN1_BIT_STRING_new());
  ASSERT_TRUE(val);
  static const uint8_t kBitStringEmpty[] = {0x03, 0x01, 0x00};
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitStringEmpty);
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 100));

  // Set a few bits via |ASN1_BIT_STRING_set_bit|.
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 0, 1));
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 1, 1));
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 2, 0));
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 3, 1));
  static const uint8_t kBitString1101[] = {0x03, 0x02, 0x04, 0xd0};
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString1101);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 1));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 2));
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 3));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 4));

  // Bits that were set may be cleared.
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 1, 0));
  static const uint8_t kBitString1001[] = {0x03, 0x02, 0x04, 0x90};
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString1001);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 1));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 2));
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 3));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 4));

  // Clearing trailing bits truncates the string.
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 3, 0));
  static const uint8_t kBitString1[] = {0x03, 0x02, 0x07, 0x80};
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString1);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 1));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 2));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 3));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 4));

  // Bits may be set beyond the end of the string.
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 63, 1));
  static const uint8_t kBitStringLong[] = {0x03, 0x09, 0x00, 0x80, 0x00, 0x00,
                                           0x00, 0x00, 0x00, 0x00, 0x01};
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitStringLong);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 62));
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 63));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 64));

  // The string can be truncated back down again.
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 63, 0));
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString1);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 62));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 63));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 64));

  // |ASN1_BIT_STRING_set_bit| also truncates when starting from a parsed
  // string.
  const uint8_t *ptr = kBitStringLong;
  val.reset(d2i_ASN1_BIT_STRING(nullptr, &ptr, sizeof(kBitStringLong)));
  ASSERT_TRUE(val);
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitStringLong);
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 63, 0));
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString1);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 62));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 63));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 64));

  // A parsed bit string preserves trailing zero bits.
  static const uint8_t kBitString10010[] = {0x03, 0x02, 0x03, 0x90};
  ptr = kBitString10010;
  val.reset(d2i_ASN1_BIT_STRING(nullptr, &ptr, sizeof(kBitString10010)));
  ASSERT_TRUE(val);
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString10010);
  // But |ASN1_BIT_STRING_set_bit| will truncate it even if otherwise a no-op.
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(val.get(), 0, 1));
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitString1001);
  EXPECT_EQ(1, ASN1_BIT_STRING_get_bit(val.get(), 0));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 62));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 63));
  EXPECT_EQ(0, ASN1_BIT_STRING_get_bit(val.get(), 64));

  // By default, a BIT STRING implicitly truncates trailing zeros.
  val.reset(ASN1_BIT_STRING_new());
  ASSERT_TRUE(val);
  static const uint8_t kZeros[64] = {0};
  ASSERT_TRUE(ASN1_STRING_set(val.get(), kZeros, sizeof(kZeros)));
  TestSerialize(val.get(), i2d_ASN1_BIT_STRING, kBitStringEmpty);
}